

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::UCharCharacterIterator::setIndex32(UCharCharacterIterator *this,int32_t position)

{
  uint local_24;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  int32_t position_local;
  UCharCharacterIterator *this_local;
  
  if (position < (this->super_CharacterIterator).begin) {
    c = (this->super_CharacterIterator).begin;
  }
  else {
    c = position;
    if ((this->super_CharacterIterator).end < position) {
      c = (this->super_CharacterIterator).end;
    }
  }
  if (c < (this->super_CharacterIterator).end) {
    if ((((this->text[c] & 0xfc00U) == 0xdc00) && ((this->super_CharacterIterator).begin < c)) &&
       ((this->text[c + -1] & 0xfc00U) == 0xd800)) {
      c = c + -1;
    }
    (this->super_CharacterIterator).pos = c;
    local_24 = (uint)(ushort)this->text[c];
    if ((((local_24 & 0xfffffc00) == 0xd800) && (c + 1 != (this->super_CharacterIterator).end)) &&
       ((this->text[c + 1] & 0xfc00U) == 0xdc00)) {
      local_24 = local_24 * 0x400 + (uint)(ushort)this->text[c + 1] + 0xfca02400;
    }
    this_local._4_4_ = local_24;
  }
  else {
    (this->super_CharacterIterator).pos = c;
    this_local._4_4_ = 0xffff;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UCharCharacterIterator::setIndex32(int32_t position) {
    if(position < begin) {
        position = begin;
    } else if(position > end) {
        position = end;
    }
    if(position < end) {
        U16_SET_CP_START(text, begin, position);
        int32_t i = this->pos = position;
        UChar32 c;
        U16_NEXT(text, i, end, c);
        return c;
    } else {
        this->pos = position;
        return DONE;
    }
}